

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<2>::operator()
          (_defaultInitializer<2> *this,char (*param_1) [240],char *param_2)

{
  DeadlyImportError *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Constructing BlenderDNA Structure encountered an error",&local_39)
  ;
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void operator ()(T& /*out*/,const char* = "") {
        // obviously, it is crucial that _DefaultInitializer is used
        // only from within a catch clause.
        throw DeadlyImportError("Constructing BlenderDNA Structure encountered an error");
    }